

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O2

void IDisk::FillTrack(uchar *track_buffer,uchar cylinder,DiskType type,uint sizeOftrack)

{
  unsigned_short uVar1;
  uint uVar2;
  int iVar3;
  uchar *puVar4;
  int iVar5;
  long lVar6;
  bool bVar7;
  CRC crc;
  
  uVar2 = 0;
  iVar5 = 0x50;
  while (bVar7 = iVar5 != 0, iVar5 = iVar5 + -1, bVar7) {
    uVar2 = AddByteToTrack(track_buffer,uVar2,'N',8,'\0');
  }
  iVar5 = 0xc;
  while (bVar7 = iVar5 != 0, iVar5 = iVar5 + -1, bVar7) {
    uVar2 = AddByteToTrack(track_buffer,uVar2,'\0',8,'\0');
  }
  uVar2 = AddSyncByteToTrack(track_buffer,uVar2,0xc2);
  uVar2 = AddSyncByteToTrack(track_buffer,uVar2,0xc2);
  uVar2 = AddSyncByteToTrack(track_buffer,uVar2,0xc2);
  uVar2 = AddByteToTrack(track_buffer,uVar2,0xfc,8,'\0');
  iVar5 = 0x32;
  while (bVar7 = iVar5 != 0, iVar5 = iVar5 + -1, bVar7) {
    uVar2 = AddByteToTrack(track_buffer,uVar2,'N',8,'\0');
  }
  puVar4 = data_track;
  if (type == VENDOR) {
    puVar4 = "AFBGCHDIE";
  }
  for (lVar6 = 0; lVar6 != 9; lVar6 = lVar6 + 1) {
    CRC::CRC(&crc);
    iVar5 = 0xc;
    while (bVar7 = iVar5 != 0, iVar5 = iVar5 + -1, bVar7) {
      uVar2 = AddByteWithCrc(track_buffer,uVar2,'\0',&crc,false);
    }
    CRC::Reset(&crc);
    iVar5 = AddByteWithCrc(track_buffer,uVar2,0xa1,&crc,true);
    iVar5 = AddByteWithCrc(track_buffer,iVar5,0xa1,&crc,true);
    iVar5 = AddByteWithCrc(track_buffer,iVar5,0xa1,&crc,true);
    iVar5 = AddByteWithCrc(track_buffer,iVar5,0xfe,&crc,false);
    iVar5 = AddByteWithCrc(track_buffer,iVar5,cylinder,&crc,false);
    iVar5 = AddByteWithCrc(track_buffer,iVar5,'\0',&crc,false);
    iVar5 = AddByteWithCrc(track_buffer,iVar5,puVar4[lVar6],&crc,false);
    iVar5 = AddByteWithCrc(track_buffer,iVar5,'\x02',&crc,false);
    uVar1 = crc.computed_crc_;
    iVar5 = AddByteWithCrc(track_buffer,iVar5,(uchar)(crc.computed_crc_ >> 8),&crc,false);
    iVar3 = AddByteWithCrc(track_buffer,iVar5,(uchar)uVar1,&crc,false);
    CRC::Reset(&crc);
    iVar5 = 0x16;
    while (bVar7 = iVar5 != 0, iVar5 = iVar5 + -1, bVar7) {
      iVar3 = AddByteWithCrc(track_buffer,iVar3,'N',&crc,false);
    }
    iVar5 = 0xc;
    while (bVar7 = iVar5 != 0, iVar5 = iVar5 + -1, bVar7) {
      iVar3 = AddByteWithCrc(track_buffer,iVar3,'\0',&crc,false);
    }
    CRC::Reset(&crc);
    iVar5 = AddByteWithCrc(track_buffer,iVar3,0xa1,&crc,true);
    iVar5 = AddByteWithCrc(track_buffer,iVar5,0xa1,&crc,true);
    iVar5 = AddByteWithCrc(track_buffer,iVar5,0xa1,&crc,true);
    iVar5 = AddByteWithCrc(track_buffer,iVar5,0xfb,&crc,false);
    iVar3 = 0x200;
    while (uVar1 = crc.computed_crc_, bVar7 = iVar3 != 0, iVar3 = iVar3 + -1, bVar7) {
      iVar5 = AddByteWithCrc(track_buffer,iVar5,0xe5,&crc,false);
    }
    iVar5 = AddByteWithoutCrc(track_buffer,iVar5,(uchar)(crc.computed_crc_ >> 8),false);
    uVar2 = AddByteWithoutCrc(track_buffer,iVar5,(uchar)uVar1,false);
    iVar5 = 0x4e;
    while (bVar7 = iVar5 != 0, iVar5 = iVar5 + -1, bVar7) {
      uVar2 = AddByteWithoutCrc(track_buffer,uVar2,'N',false);
    }
    CRC::~CRC(&crc);
  }
  for (; (int)uVar2 < 0x18691; uVar2 = AddByteWithoutCrc(track_buffer,uVar2,'N',false)) {
  }
  puVar4 = track_buffer + uVar2;
  for (; (int)uVar2 < (int)sizeOftrack; uVar2 = uVar2 + 1) {
    *puVar4 = '\x04';
    puVar4 = puVar4 + 1;
  }
  return;
}

Assistant:

void IDisk::FillTrack(unsigned char* track_buffer, const unsigned char cylinder, IDisk::DiskType type,
                      unsigned int sizeOftrack)
{
   int j;
   int load_disk_index = 0;

   unsigned char* chrns;
   switch (type)
   {
   case VENDOR:
      chrns = vendor_track;
      break;
   case DATA:
   default:
      chrns = data_track;
      break;
   }

   // Fill the track :
   //  GAP 4a : 80 octets � #4E
   for (j = 0; j < 80; j++) load_disk_index = AddByteToTrack(track_buffer, load_disk_index, 0x4E);

   //  Sync : 12 octets � #00
   for (j = 0; j < 12; j++) load_disk_index = AddByteToTrack(track_buffer, load_disk_index, 0x00);

   //  IAM : 3 octets � #C2 + 1 octet � #FC
   load_disk_index = AddSyncByteToTrack(track_buffer, load_disk_index, 0xC2);
   load_disk_index = AddSyncByteToTrack(track_buffer, load_disk_index, 0xC2);
   load_disk_index = AddSyncByteToTrack(track_buffer, load_disk_index, 0xC2);
   load_disk_index = AddByteToTrack(track_buffer, load_disk_index, 0xFC);

   // GAP 1 : 50 byte with 0x4E value
   for (j = 0; j < 50; j++) load_disk_index = AddByteToTrack(track_buffer, load_disk_index, 0x4E);

   // Then, each sectors :
   for (unsigned int s = 0; s < 9; s++)
   {
      CRC crc;
      // - Sync : 12 byte, value #00
      for (j = 0; j < 12; j++) load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0x00, crc, false);

      crc.Reset();
      // - IDAM : 3 byte #A1 + 1 byte #FE
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0xA1, crc, true);
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0xA1, crc, true);
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0xA1, crc, true);
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0xFE, crc);

      // Index
      // - C (identification secteur 'C' = 1 byte)
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, cylinder, crc);
      // - H (identification secteur 'H' = 1 byte)
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0, crc);
      // - R (identification secteur 'R' = 1 byte)
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, chrns[s], crc);
      // - N (identification secteur 'N' = 1 byte)
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 2, crc);

      unsigned short computed_crc = crc.GetCRC();
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, (computed_crc >> 8), crc);
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, (computed_crc & 0xFF), crc);

      crc.Reset();

      // - GAP 2 (22 bytes #4E)
      for (j = 0; j < 22; j++) load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0x4E, crc);

      // - Sync : 12 bytes #00
      for (j = 0; j < 12; j++) load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0x00, crc);

      crc.Reset();
      // - DATA AM : 3 bytes #A1 + 1 bytes #FB ou #F8
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0xA1, crc, true);
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0xA1, crc, true);
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0xA1, crc, true);
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, DAAM_OFF, crc);

      // With extension, CRC and GAP#3 are in the floppy
      for (unsigned int k = 0; k < 0x200; k++)
      {
         load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0xE5, crc);
      }

      // - Crc (2 bytes) - If needed....
      computed_crc = crc.GetCRC();
      load_disk_index = IDisk::AddByteWithoutCrc(track_buffer, load_disk_index, (computed_crc >> 8));
      load_disk_index = IDisk::AddByteWithoutCrc(track_buffer, load_disk_index, (computed_crc & 0xFF));

      // - GAP #3 (x bytes)
      for (j = 0; j < 78; j++)
      {
         load_disk_index = IDisk::AddByteWithoutCrc(track_buffer, load_disk_index, 0x4E);
      }
   }
   // End of track
   for (; load_disk_index < 6250 * 16 - 15;)
   {
      load_disk_index = IDisk::AddByteWithoutCrc(track_buffer, load_disk_index, 0x4E);
   }

   for (; load_disk_index < static_cast<int>(sizeOftrack); load_disk_index++)
   {
      track_buffer[load_disk_index] = BIT_WEAK;
   }
}